

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlloader.c
# Opt level: O1

void * CMdlopen(void *CMTrace_filev,char *in_lib,int mode)

{
  int iVar1;
  char *pcVar2;
  char *__dest;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  char *pcVar9;
  char **ppcVar10;
  
  if (dlopen_verbose == -1) {
    pcVar2 = getenv("CMTransportVerbose");
    dlopen_verbose = (int)(pcVar2 != (char *)0x0);
  }
  pcVar2 = strrchr(in_lib,0x2e);
  if (dlopen_verbose != 0) {
    fprintf((FILE *)CMTrace_filev,"Trying to dlopen %s\n",in_lib);
  }
  if ((pcVar2 == (char *)0x0) || (iVar1 = strcmp(pcVar2,".la"), iVar1 != 0)) {
    __dest = strdup(in_lib);
  }
  else {
    sVar3 = strlen(in_lib);
    __dest = (char *)malloc(sVar3 + 0xb);
    strcpy(__dest,in_lib);
    pcVar9 = strrchr(__dest,0x2e);
    builtin_strncpy(pcVar9,".so",4);
    if (dlopen_verbose != 0) {
      fprintf((FILE *)CMTrace_filev,"Dlopen module name replaced, now %s\n",__dest);
    }
  }
  if ((search_list == (char **)0x0) ||
     (pcVar9 = *search_list, ppcVar10 = search_list, pcVar9 == (char *)0x0)) {
    lVar6 = 0;
  }
  else {
    do {
      sVar3 = strlen(pcVar9);
      sVar4 = strlen(__dest);
      pcVar5 = (char *)malloc(sVar3 + sVar4 + 2);
      sprintf(pcVar5,"%s/%s",pcVar9,__dest);
      lVar6 = dlopen(pcVar5,1);
      lVar7 = dlerror();
      if (dlopen_verbose != 0) {
        if (lVar7 == 0) {
          fprintf((FILE *)CMTrace_filev,"DLopen of %s succeeded\n",pcVar5);
        }
        else {
          fprintf((FILE *)CMTrace_filev,"Failed to dlopen %s, error is %s\n",pcVar5,lVar7);
        }
      }
      free(pcVar5);
    } while ((lVar6 == 0) && (pcVar9 = ppcVar10[1], ppcVar10 = ppcVar10 + 1, pcVar9 != (char *)0x0))
    ;
  }
  if (lVar6 == 0) {
    lVar6 = dlopen(__dest,1);
    lVar7 = dlerror();
    if (dlopen_verbose != 0) {
      if (lVar7 == 0) {
        fprintf((FILE *)CMTrace_filev,"DLopen of %s succeeded\n",pcVar2);
      }
      else {
        fprintf((FILE *)CMTrace_filev,"Failed to dlopen %s, error is %s\n",pcVar2,lVar7);
      }
    }
  }
  if (lVar6 == 0) {
    plVar8 = (long *)0x0;
  }
  else {
    plVar8 = (long *)malloc(0x10);
    pcVar2 = strrchr(__dest,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = __dest;
    }
    pcVar9 = strstr(pcVar2,"adios2_");
    sVar3 = strlen(pcVar2);
    if (pcVar9 == (char *)0x0) {
      pcVar5 = (char *)malloc(sVar3 + 4);
      plVar8[1] = (long)pcVar5;
    }
    else {
      pcVar5 = (char *)malloc(sVar3 - 3);
      plVar8[1] = (long)pcVar5;
      strncpy(pcVar5,pcVar2,(long)pcVar9 - (long)pcVar2);
      pcVar5 = pcVar5 + ((long)pcVar9 - (long)pcVar2);
      pcVar2 = pcVar9 + 7;
    }
    strcpy(pcVar5,pcVar2);
    pcVar2 = strrchr((char *)plVar8[1],0x2e);
    builtin_strncpy(pcVar2,"_LTX_",6);
    *plVar8 = lVar6;
    free(__dest);
  }
  return plVar8;
}

Assistant:

void *
CMdlopen(void *CMTrace_filev, char *in_lib, int mode)
{
#if NO_DYNAMIC_LINKING
    return NULL;
#else
    dlhandle dlh;
    void *handle = NULL;
    char *tmp;
    char *lib;
    FILE *CMTrace_file = (FILE*)CMTrace_filev;
    if (dlopen_verbose == -1) {
	dlopen_verbose = (getenv("CMTransportVerbose") != NULL);
    }
    tmp = strrchr(in_lib, '.');
    if (dlopen_verbose) fprintf(CMTrace_file, "Trying to dlopen %s\n", in_lib);
    if (tmp && (strcmp(tmp, ".la") == 0)) {
	/* can't open .la files */
	lib = malloc(strlen(in_lib) + strlen(MODULE_EXT) + 8);
	strcpy(lib, in_lib);
	strcpy(strrchr(lib, '.'), MODULE_EXT);
	if (dlopen_verbose) fprintf(CMTrace_file, "Dlopen module name replaced, now %s\n", lib);
    } else {
	lib = strdup(in_lib);
    }
    char **list = search_list;
    while(list && (list[0] != NULL)) {
        char *tmp = malloc(strlen(list[0]) + strlen(lib) + 2);
	sprintf(tmp, "%s/%s", list[0], lib);
	handle = dlopen(tmp, RTLD_LAZY);
	const char *err = dlerror();
	if (dlopen_verbose) {
	    if (err) {
		fprintf(CMTrace_file, "Failed to dlopen %s, error is %s\n", tmp, err);
	    } else {
		fprintf(CMTrace_file, "DLopen of %s succeeded\n", tmp);
	    }
	}
	free(tmp);
 	list++;
	if (handle) list = NULL; // fall out
    }
    if (!handle) {
        handle = dlopen(lib, RTLD_LAZY);
	const char *err = dlerror();
	if (dlopen_verbose) {
	    if (err) {
		fprintf(CMTrace_file, "Failed to dlopen %s, error is %s\n", tmp, err);
	    } else {
		fprintf(CMTrace_file, "DLopen of %s succeeded\n", tmp);
	    }
	}
    }
    if (!handle) return NULL;
    dlh = malloc(sizeof(*dlh));
    tmp = strrchr(lib, '/'); /* find name start */
    if (!tmp) tmp = lib;

    char *cm_lib_prefix;
    if(strlen(CM_LIBRARY_PREFIX) > 0 &&
      (cm_lib_prefix = strstr(tmp, CM_LIBRARY_PREFIX))) {
      dlh->lib_prefix = malloc(strlen(tmp) - strlen(CM_LIBRARY_PREFIX) + 4);
      strncpy(dlh->lib_prefix, tmp, cm_lib_prefix-tmp);
      strcpy(dlh->lib_prefix + (cm_lib_prefix - tmp),
          cm_lib_prefix + strlen(CM_LIBRARY_PREFIX));
    }
    else {
      dlh->lib_prefix = malloc(strlen(tmp) + 4);
      strcpy(dlh->lib_prefix, tmp);
    }
    tmp = strrchr(dlh->lib_prefix, '.');
    strcpy(tmp, "_LTX_");  /* kill postfix, add _LTX_ */
    dlh->dlopen_handle = handle;
    free(lib);
    return (void*)dlh;
#endif
}